

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O3

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
getOpenFileImpl<llvm::MemoryBuffer>
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,int FD,Twine *Filename,uint64_t FileSize,uint64_t MapSize,
          int64_t Offset,bool RequiresNullTerminator,bool IsVolatile)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  char *pcVar5;
  int *piVar6;
  ssize_t sVar7;
  char acVar8 [8];
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *pEVar9;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  *extraout_RAX;
  long lVar10;
  void *__buf;
  error_code eVar11;
  file_status Status;
  undefined1 local_98 [24];
  uid_t uStack_80;
  gid_t local_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  file_type fStack_70;
  perms local_6c;
  dev_t local_68;
  nlink_t nStack_60;
  ino_t local_58;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>_2
  local_48;
  byte local_38;
  
  if (getOpenFileImpl<llvm::MemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
      ::PageSize == '\0') {
    getOpenFileImpl<llvm::MemoryBuffer>();
  }
  if ((MapSize == 0xffffffffffffffff) && (MapSize = FileSize, FileSize == 0xffffffffffffffff)) {
    uStack_78 = 0;
    uStack_74 = 0;
    fStack_70 = status_error;
    local_98._16_8_ = (char *)0x0;
    uStack_80 = 0;
    local_7c = 0;
    local_98[0] = '\0';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    local_98._8_8_ = (error_category *)0x0;
    local_6c = perms_not_known;
    local_68 = 0;
    nStack_60 = 0;
    local_58 = 0;
    eVar11 = llvm::sys::fs::status(FD,(file_status *)local_98);
    if (eVar11._M_value != 0) {
      __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
      *(int *)&__return_storage_ptr__->field_0 = eVar11._M_value;
      *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar11._M_cat;
      return eVar11._0_8_;
    }
    if ((fStack_70 != regular_file) && (fStack_70 != block_file)) {
      getMemoryBufferForStream
                ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                  *)&local_48.TStorage,FD,Filename);
      llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
      moveConstruct<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  *)__return_storage_ptr__,
                 (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                  *)&local_48.TStorage);
      pEVar9 = extraout_RAX;
      if ((local_38 & 1) != 0) {
        return extraout_RAX;
      }
LAB_00177cbd:
      if (local_48.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer ==
          (AlignedCharArray<8UL,_8UL>)0x0) {
        return pEVar9;
      }
      pEVar9 = (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                *)(**(code **)(*(long *)local_48.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer +
                              8))();
      return pEVar9;
    }
    FileSize = CONCAT44(uStack_74,uStack_78);
    MapSize = FileSize;
  }
  bVar1 = shouldUseMmap(FD,FileSize,MapSize,Offset,RequiresNullTerminator,
                        getOpenFileImpl<llvm::MemoryBuffer>::PageSize,IsVolatile);
  if (bVar1) {
    local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
    local_98._8_8_ = std::_V2::system_category();
    plVar4 = (long *)operator_new(0x30,(NamedBufferAlloc *)Filename);
    *plVar4 = (long)&PTR__MemoryBufferMMapFile_001ffef0;
    iVar2 = llvm::sys::fs::mapped_file_region::alignment();
    iVar3 = llvm::sys::fs::mapped_file_region::alignment();
    llvm::sys::fs::mapped_file_region::mapped_file_region
              ((mapped_file_region *)(plVar4 + 3),FD,readonly,(iVar2 + -1 & Offset) + MapSize,
               -iVar3 & Offset,(error_code *)local_98);
    if (local_98._0_4_ == 0) {
      pcVar5 = llvm::sys::fs::mapped_file_region::const_data((mapped_file_region *)(plVar4 + 3));
      iVar2 = llvm::sys::fs::mapped_file_region::alignment();
      pcVar5 = pcVar5 + (iVar2 + -1 & Offset);
      if ((RequiresNullTerminator) && (pcVar5[MapSize] != '\0')) {
        __assert_fail("(!RequiresNullTerminator || BufEnd[0] == 0) && \"Buffer is not null terminated!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/MemoryBuffer.cpp"
                      ,0x31,"void llvm::MemoryBuffer::init(const char *, const char *, bool)");
      }
      plVar4[1] = (long)pcVar5;
      plVar4[2] = (long)(pcVar5 + MapSize);
      if (local_98._0_4_ == 0) {
        __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
        *(long **)&__return_storage_ptr__->field_0 = plVar4;
        return __return_storage_ptr__;
      }
    }
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  llvm::WritableMemoryBuffer::getNewUninitMemBuffer
            ((WritableMemoryBuffer *)local_98,MapSize,Filename);
  acVar8 = (char  [8])local_98._0_8_;
  if ((char  [8])local_98._0_8_ == (char  [8])0x0) {
    acVar8 = (char  [8])std::_V2::generic_category();
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(undefined4 *)&__return_storage_ptr__->field_0 = 0xc;
    *(char (*) [8])((long)&__return_storage_ptr__->field_0 + 8) = acVar8;
  }
  else {
    if (MapSize != 0) {
      __buf = *(void **)(local_98._0_8_ + 8);
      lVar10 = Offset + MapSize;
      piVar6 = __errno_location();
      do {
        while( true ) {
          *piVar6 = 0;
          sVar7 = pread(FD,__buf,MapSize,lVar10 - MapSize);
          if (sVar7 != -1) break;
          iVar2 = *piVar6;
          if (iVar2 != 4) {
            pEVar9 = (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                      *)std::_V2::generic_category();
            __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
            *(int *)&__return_storage_ptr__->field_0 = iVar2;
            *(ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              **)((long)&__return_storage_ptr__->field_0 + 8) = pEVar9;
            local_48.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArrayUnion<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
                  )acVar8;
            goto LAB_00177cbd;
          }
        }
        if (sVar7 == 0) {
          memset(__buf,0,MapSize);
          break;
        }
        __buf = (void *)((long)__buf + sVar7);
        MapSize = MapSize - sVar7;
      } while (MapSize != 0);
    }
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
    *(char (*) [8])&__return_storage_ptr__->field_0 = acVar8;
  }
  return (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *)
         acVar8;
}

Assistant:

static ErrorOr<std::unique_ptr<MB>>
getOpenFileImpl(int FD, const Twine &Filename, uint64_t FileSize,
                uint64_t MapSize, int64_t Offset, bool RequiresNullTerminator,
                bool IsVolatile) {
  static int PageSize = sys::Process::getPageSize();

  // Default is to map the full file.
  if (MapSize == uint64_t(-1)) {
    // If we don't know the file size, use fstat to find out.  fstat on an open
    // file descriptor is cheaper than stat on a random path.
    if (FileSize == uint64_t(-1)) {
      sys::fs::file_status Status;
      std::error_code EC = sys::fs::status(FD, Status);
      if (EC)
        return EC;

      // If this not a file or a block device (e.g. it's a named pipe
      // or character device), we can't trust the size. Create the memory
      // buffer by copying off the stream.
      sys::fs::file_type Type = Status.type();
      if (Type != sys::fs::file_type::regular_file &&
          Type != sys::fs::file_type::block_file)
        return getMemoryBufferForStream(FD, Filename);

      FileSize = Status.getSize();
    }
    MapSize = FileSize;
  }

  if (shouldUseMmap(FD, FileSize, MapSize, Offset, RequiresNullTerminator,
                    PageSize, IsVolatile)) {
    std::error_code EC;
    std::unique_ptr<MB> Result(
        new (NamedBufferAlloc(Filename)) MemoryBufferMMapFile<MB>(
            RequiresNullTerminator, FD, MapSize, Offset, EC));
    if (!EC)
      return std::move(Result);
  }

  auto Buf = WritableMemoryBuffer::getNewUninitMemBuffer(MapSize, Filename);
  if (!Buf) {
    // Failed to create a buffer. The only way it can fail is if
    // new(std::nothrow) returns 0.
    return make_error_code(errc::not_enough_memory);
  }

  char *BufPtr = Buf.get()->getBufferStart();

  size_t BytesLeft = MapSize;
#ifndef HAVE_PREAD
  if (lseek(FD, Offset, SEEK_SET) == -1)
    return std::error_code(errno, std::generic_category());
#endif

  while (BytesLeft) {
#ifdef HAVE_PREAD
    ssize_t NumRead = sys::RetryAfterSignal(-1, ::pread, FD, BufPtr, BytesLeft,
                                            MapSize - BytesLeft + Offset);
#else
    ssize_t NumRead = sys::RetryAfterSignal(-1, ::read, FD, BufPtr, BytesLeft);
#endif
    if (NumRead == -1) {
      // Error while reading.
      return std::error_code(errno, std::generic_category());
    }
    if (NumRead == 0) {
      memset(BufPtr, 0, BytesLeft); // zero-initialize rest of the buffer.
      break;
    }
    BytesLeft -= NumRead;
    BufPtr += NumRead;
  }

  return std::move(Buf);
}